

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O2

int32_t parse_sort_id_bfr(Btor2Parser *bfr,Btor2Sort *res)

{
  Btor2Line *pBVar1;
  int64_t iVar2;
  int64_t iVar3;
  Btor2SortTag BVar4;
  undefined4 uVar5;
  int32_t iVar6;
  long lVar7;
  char *fmt;
  int64_t sort_id;
  
  iVar6 = parse_id_bfr(bfr,&sort_id);
  if (iVar6 == 0) {
    return 0;
  }
  if (sort_id < bfr->ntable) {
    lVar7 = -sort_id;
    if (0 < sort_id) {
      lVar7 = sort_id;
    }
    if ((lVar7 < bfr->ntable && sort_id != 0) &&
       (pBVar1 = bfr->table[lVar7], pBVar1 != (Btor2Line *)0x0)) {
      if (pBVar1->tag == BTOR2_TAG_sort) {
        (res->field_3).array.element = (pBVar1->sort).field_3.array.element;
        iVar2 = (pBVar1->sort).id;
        BVar4 = (pBVar1->sort).tag;
        uVar5 = *(undefined4 *)&(pBVar1->sort).field_0xc;
        iVar3 = (pBVar1->sort).field_3.array.index;
        res->name = (pBVar1->sort).name;
        (res->field_3).array.index = iVar3;
        res->id = iVar2;
        res->tag = BVar4;
        *(undefined4 *)&res->field_0xc = uVar5;
        return 1;
      }
      fmt = "id after tag is not a sort id";
      goto LAB_001037e1;
    }
  }
  fmt = "undefined sort id";
LAB_001037e1:
  perr_bfr(bfr,fmt);
  return 0;
}

Assistant:

static int32_t
parse_sort_id_bfr (Btor2Parser *bfr, Btor2Sort *res)
{
  int64_t sort_id;
  Btor2Line *s;
  if (!parse_id_bfr (bfr, &sort_id)) return 0;

  if (sort_id >= bfr->ntable || id2line_bfr (bfr, sort_id) == 0)
    return perr_bfr (bfr, "undefined sort id");

  s = id2line_bfr (bfr, sort_id);
  if (s->tag != BTOR2_TAG_sort)
    return perr_bfr (bfr, "id after tag is not a sort id");
  *res = s->sort;
  return 1;
}